

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O2

void luaT_callTMres(lua_State *L,TValue *f,TValue *p1,TValue *p2,StkId res)

{
  StkId pSVar1;
  long lVar2;
  long lVar3;
  
  pSVar1 = (L->top).p;
  lVar3 = (L->stack).offset;
  (pSVar1->val).value_ = f->value_;
  (pSVar1->val).tt_ = f->tt_;
  pSVar1[1].val.value_ = p1->value_;
  *(lu_byte *)((long)pSVar1 + 0x18) = p1->tt_;
  pSVar1[2].val.value_ = p2->value_;
  *(lu_byte *)((long)pSVar1 + 0x28) = p2->tt_;
  (L->top).p = (StkId)((L->top).offset + 0x30);
  if ((L->ci->callstatus & 10) == 0) {
    luaD_call(L,pSVar1,1);
  }
  else {
    luaD_callnoyield(L,pSVar1,1);
  }
  lVar3 = (long)res - lVar3;
  lVar2 = (L->top).offset;
  pSVar1 = (L->stack).p;
  (L->top).p = (StkId)(lVar2 + -0x10);
  *(undefined8 *)((long)pSVar1 + lVar3) = *(undefined8 *)(lVar2 + -0x10);
  *(undefined1 *)((long)pSVar1 + lVar3 + 8) = *(undefined1 *)(lVar2 + -8);
  return;
}

Assistant:

void luaT_callTMres (lua_State *L, const TValue *f, const TValue *p1,
                     const TValue *p2, StkId res) {
  ptrdiff_t result = savestack(L, res);
  StkId func = L->top.p;
  setobj2s(L, func, f);  /* push function (assume EXTRA_STACK) */
  setobj2s(L, func + 1, p1);  /* 1st argument */
  setobj2s(L, func + 2, p2);  /* 2nd argument */
  L->top.p += 3;
  /* metamethod may yield only when called from Lua code */
  if (isLuacode(L->ci))
    luaD_call(L, func, 1);
  else
    luaD_callnoyield(L, func, 1);
  res = restorestack(L, result);
  setobjs2s(L, res, --L->top.p);  /* move result to its place */
}